

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTask.h
# Opt level: O0

HighsSplitDeque * __thiscall HighsTask::run(HighsTask *this,HighsSplitDeque *stealer)

{
  __int_type_conflict _Var1;
  CallableBase *pCVar2;
  HighsSplitDeque *pHVar3;
  Metadata *pMVar4;
  HighsSplitDeque *in_RSI;
  HighsTask *in_RDI;
  bool bVar5;
  uintptr_t state;
  ulong uStack_78;
  
  pMVar4 = &in_RDI->metadata;
  uStack_78 = (pMVar4->stealer).super___atomic_base<unsigned_long>._M_i;
  do {
    LOCK();
    _Var1 = (pMVar4->stealer).super___atomic_base<unsigned_long>._M_i;
    bVar5 = uStack_78 == _Var1;
    if (bVar5) {
      (pMVar4->stealer).super___atomic_base<unsigned_long>._M_i = uStack_78 | (ulong)in_RSI;
      _Var1 = uStack_78;
    }
    UNLOCK();
    uStack_78 = _Var1;
  } while (!bVar5);
  if (_Var1 == 0) {
    pCVar2 = getCallable(in_RDI);
    (**pCVar2->_vptr_CallableBase)();
  }
  pHVar3 = markAsFinished(in_RDI,in_RSI);
  return pHVar3;
}

Assistant:

HighsSplitDeque* run(HighsSplitDeque* stealer) {
    uintptr_t state = metadata.stealer.fetch_or(
        reinterpret_cast<uintptr_t>(stealer), std::memory_order_acquire);
    if (state == 0) getCallable()();

    return markAsFinished(stealer);
  }